

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void SanitizeFormatString(char *fmt,char *fmt_out,size_t fmt_out_size)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char c;
  char *fmt_end;
  size_t fmt_out_size_local;
  char *fmt_out_local;
  char *fmt_local;
  
  pcVar2 = ImParseFormatFindEnd(fmt);
  fmt_out_size_local = (size_t)fmt_out;
  fmt_out_local = fmt;
  if (fmt_out_size <= pcVar2 + (1 - (long)fmt)) {
    __assert_fail("(size_t)(fmt_end - fmt + 1) < fmt_out_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_widgets.cpp"
                  ,0x839,"void SanitizeFormatString(const char *, char *, size_t)");
  }
  while (fmt_out_local < pcVar2) {
    pcVar3 = fmt_out_local + 1;
    cVar1 = *fmt_out_local;
    fmt_out_local = pcVar3;
    if (((cVar1 != '\'') && (cVar1 != '$')) && (cVar1 != '_')) {
      *(char *)fmt_out_size_local = cVar1;
      fmt_out_size_local = fmt_out_size_local + 1;
    }
  }
  *(undefined1 *)fmt_out_size_local = 0;
  return;
}

Assistant:

static void SanitizeFormatString(const char* fmt, char* fmt_out, size_t fmt_out_size)
{
    IM_UNUSED(fmt_out_size);
    const char* fmt_end = ImParseFormatFindEnd(fmt);
    IM_ASSERT((size_t)(fmt_end - fmt + 1) < fmt_out_size); // Format is too long, let us know if this happens to you!
    while (fmt < fmt_end)
    {
        char c = *(fmt++);
        if (c != '\'' && c != '$' && c != '_') // Custom flags provided by stb_sprintf.h. POSIX 2008 also supports '.
            *(fmt_out++) = c;
    }
    *fmt_out = 0; // Zero-terminate
}